

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseXMLParser.cpp
# Opt level: O1

bool __thiscall Rml::BaseXMLParser::PeekString(BaseXMLParser *this,char *string,bool consume)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  
  sVar2 = this->xml_index;
  iVar1 = this->line_number;
  bVar6 = true;
  iVar7 = 0;
  do {
    if (string[iVar7] == '\0') break;
    if ((this->xml_source)._M_string_length <= this->xml_index) {
      bVar6 = false;
      break;
    }
    bVar5 = Look(this);
    if (bVar5 == 10) {
      this->line_number = this->line_number + 1;
    }
    if (((iVar7 == 0) && (bVar5 < 0x21)) &&
       (iVar4 = 0, (0x100002600U >> ((ulong)bVar5 & 0x3f) & 1) != 0)) {
LAB_001e2e63:
      iVar7 = iVar4;
      this->xml_index = this->xml_index + 1;
      bVar3 = true;
    }
    else {
      bVar3 = false;
      if (bVar5 == string[iVar7]) {
        iVar4 = iVar7 + 1;
        goto LAB_001e2e63;
      }
      bVar6 = false;
    }
  } while (bVar3);
  if ((!consume) || (!bVar6)) {
    this->xml_index = sVar2;
    this->line_number = iVar1;
  }
  return bVar6;
}

Assistant:

bool BaseXMLParser::PeekString(const char* string, bool consume)
{
	const size_t start_index = xml_index;
	const int start_line = line_number;
	bool success = true;
	int i = 0;
	while (string[i])
	{
		if (AtEnd())
		{
			success = false;
			break;
		}

		const char c = Look();

		// Count line numbers
		if (c == '\n')
		{
			line_number++;
		}

		// Seek past all the whitespace if we haven't hit the initial character yet.
		if (i == 0 && StringUtilities::IsWhitespace(c))
		{
			Next();
		}
		else
		{
			if (c != string[i])
			{
				success = false;
				break;
			}

			i++;
			Next();
		}
	}

	// Set the index to the start index unless we are consuming.
	if (!consume || !success)
	{
		xml_index = start_index;
		line_number = start_line;
	}

	return success;
}